

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * kj::StringTree::concat<>(void)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  StringTree *in_RDI;
  String local_28;
  
  (in_RDI->branches).ptr = (Branch *)0x0;
  (in_RDI->branches).size_ = 0;
  (in_RDI->text).content.size_ = 0;
  (in_RDI->text).content.disposer = (ArrayDisposer *)0x0;
  in_RDI->size_ = 0;
  (in_RDI->text).content.ptr = (char *)0x0;
  (in_RDI->branches).disposer = (ArrayDisposer *)0x0;
  heapString(&local_28,0);
  pcVar1 = (in_RDI->text).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (in_RDI->text).content.size_;
    (in_RDI->text).content.ptr = (char *)0x0;
    (in_RDI->text).content.size_ = 0;
    pAVar3 = (in_RDI->text).content.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  (in_RDI->text).content.ptr = local_28.content.ptr;
  (in_RDI->text).content.size_ = local_28.content.size_;
  (in_RDI->text).content.disposer = local_28.content.disposer;
  local_28.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,0,0,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::
                                   construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_28.content.size_ = 0;
  local_28.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar4 = (in_RDI->branches).ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = (in_RDI->branches).size_;
    (in_RDI->branches).ptr = (Branch *)0x0;
    (in_RDI->branches).size_ = 0;
    pAVar3 = (in_RDI->branches).disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (in_RDI->branches).ptr = (Branch *)local_28.content.ptr;
  (in_RDI->branches).size_ = local_28.content.size_;
  (in_RDI->branches).disposer = local_28.content.disposer;
  return in_RDI;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}